

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanContext.h
# Opt level: O1

void __thiscall
jaegertracing::SpanContext::
forEachBaggageItem<std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>>
          (SpanContext *this,
          function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *f)

{
  bool bVar1;
  int iVar2;
  __node_base *p_Var3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->_mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  p_Var3 = &(this->_baggage)._M_h._M_before_begin;
  do {
    p_Var3 = p_Var3->_M_nxt;
    if (p_Var3 == (__node_base *)0x0) break;
    if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    bVar1 = (*f->_M_invoker)((_Any_data *)f,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (p_Var3 + 1),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (p_Var3 + 5));
  } while (bVar1);
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  return;
}

Assistant:

void forEachBaggageItem(Function f) const
    {
        std::lock_guard<std::mutex> lock(_mutex);
        for (auto&& pair : _baggage) {
            if (!f(pair.first, pair.second)) {
                break;
            }
        }
    }